

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

ListSchema capnp::ListSchema::of(Reader elementType,Schema context)

{
  Type TVar1;
  Type TVar2;
  Reader elementType_00;
  Which primitiveType;
  ulong uVar3;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  uint64_t uVar5;
  Type TVar6;
  ListSchema LVar7;
  undefined8 uStackY_b0;
  Schema context_local;
  Fault f;
  Reader local_38;
  
  context_local = context;
  if (0xf < elementType._reader.dataSize) {
    primitiveType = *elementType._reader.data;
    switch(CONCAT62(0,primitiveType)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      goto switchD_004247aa_caseD_0;
    case 0xe:
      f.exception = (Exception *)elementType._reader.segment;
      capnp::schema::Type::List::Reader::getElementType(&local_38,(Reader *)&f);
      elementType_00._reader.capTable = local_38._reader.capTable;
      elementType_00._reader.segment = local_38._reader.segment;
      elementType_00._reader.data = local_38._reader.data;
      elementType_00._reader.pointers = local_38._reader.pointers;
      elementType_00._reader.dataSize = local_38._reader.dataSize;
      elementType_00._reader.pointerCount = local_38._reader.pointerCount;
      elementType_00._reader._38_2_ = local_38._reader._38_2_;
      elementType_00._reader.nestingLimit = local_38._reader.nestingLimit;
      elementType_00._reader._44_4_ = local_38._reader._44_4_;
      LVar7 = of(elementType_00,context_local);
      uVar3 = LVar7.elementType._0_8_ & 0xffffffffff00ffff |
              (ulong)(LVar7.elementType._0_4_ + 0x10000U & 0xff0000);
      TVar2.field_4.schema = LVar7.elementType.field_4.schema;
      TVar2.baseType = (short)uVar3;
      TVar2.listDepth = (char)(uVar3 >> 0x10);
      TVar2.isImplicitParam = (bool)(char)(uVar3 >> 0x18);
      TVar2.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar3 >> 0x20);
      TVar2._6_2_ = (short)(uVar3 >> 0x30);
      return (ListSchema)TVar2;
    case 0xf:
      if (elementType._reader.dataSize < 0x80) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint64_t *)((long)elementType._reader.data + 8);
      }
      f.exception = (Exception *)Schema::getDependency(&context_local,uVar5);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum((Schema *)&f);
      uStackY_b0 = 0xf;
      break;
    case 0x10:
      if (elementType._reader.dataSize < 0x80) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint64_t *)((long)elementType._reader.data + 8);
      }
      f.exception = (Exception *)Schema::getDependency(&context_local,uVar5);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&f);
      uStackY_b0 = 0x10;
      break;
    case 0x11:
      if (elementType._reader.dataSize < 0x80) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint64_t *)((long)elementType._reader.data + 8);
      }
      f.exception = (Exception *)Schema::getDependency(&context_local,uVar5);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asInterface((Schema *)&f);
      uStackY_b0 = 0x11;
      break;
    case 0x12:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x306,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal(&f);
    default:
      TVar6.field_4.schema = (RawBrandedSchema *)0x0;
      TVar6.baseType = primitiveType;
      TVar6.listDepth = (char)0;
      TVar6.isImplicitParam = (bool)(char)(0 >> 8);
      TVar6.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(0 >> 0x10);
      TVar6._6_2_ = (short)(0 >> 0x20);
      return (ListSchema)TVar6;
    }
    TVar1.field_4.schema = aVar4.schema;
    TVar1.baseType = (undefined2)uStackY_b0;
    TVar1.listDepth = uStackY_b0._2_1_;
    TVar1.isImplicitParam = (bool)uStackY_b0._3_1_;
    TVar1.field_3 = (anon_union_2_2_d12d5221_for_Type_3)uStackY_b0._4_2_;
    TVar1._6_2_ = uStackY_b0._6_2_;
    return (ListSchema)TVar1;
  }
  primitiveType = VOID;
switchD_004247aa_caseD_0:
  TVar6 = (Type)of(primitiveType);
  return (ListSchema)TVar6;
}

Assistant:

ListSchema ListSchema::of(schema::Type::Reader elementType, Schema context) {
  // This method is deprecated because it can only be implemented in terms of other deprecated
  // methods. Temporarily disable warnings for those other deprecated methods.
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"

  switch (elementType.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return of(elementType.which());

    case schema::Type::STRUCT:
      return of(context.getDependency(elementType.getStruct().getTypeId()).asStruct());

    case schema::Type::ENUM:
      return of(context.getDependency(elementType.getEnum().getTypeId()).asEnum());

    case schema::Type::INTERFACE:
      return of(context.getDependency(elementType.getInterface().getTypeId()).asInterface());

    case schema::Type::LIST:
      return of(of(elementType.getList().getElementType(), context));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("List(AnyPointer) not supported.");
      return ListSchema();
  }

  // Unknown type is acceptable.
  return ListSchema(elementType.which());
#pragma GCC diagnostic pop
}